

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::MembraneHook::wrap(MembraneHook *this,ClientHook *cap,MembranePolicy *policy,bool reverse)

{
  bool bVar1;
  int iVar2;
  MembraneHook *pMVar3;
  undefined4 extraout_var;
  MembranePolicy *pMVar4;
  undefined4 extraout_var_00;
  Client *pCVar5;
  RefOrVoid<capnp::MembranePolicy> pMVar6;
  ClientHook *pCVar7;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  Own<capnp::ClientHook,_std::nullptr_t> OVar8;
  HashMap<capnp::ClientHook*,capnp::ClientHook*> *local_170;
  Own<capnp::ClientHook,_std::nullptr_t> local_128;
  Client local_118;
  byte local_103;
  byte local_102;
  byte local_101;
  Own<capnp::ClientHook,_std::nullptr_t> local_100;
  Client local_f0;
  Client local_e0;
  undefined1 local_c9;
  Type local_c8;
  ClientHook *local_c0;
  ClientHook **local_b8;
  ClientHook **slot;
  HashMap<capnp::ClientHook_*,_capnp::ClientHook_*> *map;
  Client local_a0;
  byte local_8a;
  byte local_89;
  Client local_88;
  Client local_78 [2];
  Own<capnp::ClientHook,_std::nullptr_t> local_58;
  undefined1 local_48 [8];
  Client unwrapped;
  MembranePolicy *rootPolicy;
  MembraneHook *otherMembrane;
  bool reverse_local;
  MembranePolicy *policy_local;
  ClientHook *cap_local;
  Own<capnp::ClientHook,_std::nullptr_t> *result;
  
  bVar1 = ClientHook::isBrand(cap,&capnp::(anonymous_namespace)::DUMMY);
  if (bVar1) {
    pMVar3 = kj::downcast<capnp::MembraneHook,capnp::ClientHook>(cap);
    iVar2 = (*policy->_vptr_MembranePolicy[8])();
    unwrapped.hook.ptr = (ClientHook *)CONCAT44(extraout_var,iVar2);
    pMVar4 = kj::Own<capnp::MembranePolicy,_std::nullptr_t>::operator->(&pMVar3->policy);
    iVar2 = (*pMVar4->_vptr_MembranePolicy[8])();
    if (((ClientHook *)CONCAT44(extraout_var_00,iVar2) == unwrapped.hook.ptr) &&
       ((pMVar3->reverse & 1U) == ((reverse ^ 0xffU) & 1))) {
      pCVar7 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(&pMVar3->inner);
      (*pCVar7->_vptr_ClientHook[4])();
      Capability::Client::Client((Client *)local_48,&local_58);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_58);
      pCVar7 = unwrapped.hook.ptr;
      local_89 = 0;
      local_8a = 0;
      map._7_1_ = 0;
      map._6_1_ = 0;
      if (reverse) {
        pCVar5 = kj::mv<capnp::Capability::Client>((Client *)local_48);
        Capability::Client::Client(&local_88,pCVar5);
        local_89 = 1;
        pMVar6 = kj::Own<capnp::MembranePolicy,_std::nullptr_t>::operator*(&pMVar3->policy);
        (*pCVar7->_vptr_ClientHook[9])(local_78,pCVar7,&local_88,pMVar6,policy);
        local_8a = 1;
      }
      else {
        pCVar5 = kj::mv<capnp::Capability::Client>((Client *)local_48);
        Capability::Client::Client(&local_a0,pCVar5);
        map._7_1_ = 1;
        pMVar6 = kj::Own<capnp::MembranePolicy,_std::nullptr_t>::operator*(&pMVar3->policy);
        (*pCVar7->_vptr_ClientHook[10])(local_78,pCVar7,&local_a0,pMVar6,policy);
        map._6_1_ = 1;
      }
      ClientHook::from(&this->super_ClientHook,local_78);
      if ((map._6_1_ & 1) != 0) {
        Capability::Client::~Client(local_78);
      }
      if ((map._7_1_ & 1) != 0) {
        Capability::Client::~Client(&local_a0);
      }
      if ((local_8a & 1) != 0) {
        Capability::Client::~Client(local_78);
      }
      if ((local_89 & 1) != 0) {
        Capability::Client::~Client(&local_88);
      }
      Capability::Client::~Client((Client *)local_48);
      pCVar7 = extraout_RDX;
      goto LAB_004d5496;
    }
  }
  if (reverse) {
    local_170 = (HashMap<capnp::ClientHook*,capnp::ClientHook*> *)&policy->reverseWrappers;
  }
  else {
    local_170 = (HashMap<capnp::ClientHook*,capnp::ClientHook*> *)&policy->wrappers;
  }
  slot = (ClientHook **)local_170;
  local_c8.cap = cap;
  local_c0 = cap;
  local_b8 = kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::
             findOrCreate<capnp::ClientHook*,capnp::MembraneHook::wrap(capnp::ClientHook&,capnp::MembranePolicy&,bool)::_lambda()_1_>
                       (local_170,&local_c0,&local_c8);
  if (*local_b8 == (ClientHook *)0x0) {
    local_c9 = 0;
    local_101 = 0;
    local_102 = 0;
    local_103 = 0;
    if (!reverse) {
      (*cap->_vptr_ClientHook[4])(&local_128);
      Capability::Client::Client(&local_118,&local_128);
      (*policy->_vptr_MembranePolicy[7])(&local_e0,policy,&local_118);
    }
    else {
      (*cap->_vptr_ClientHook[4])();
      local_101 = 1;
      Capability::Client::Client(&local_f0,&local_100);
      local_102 = 1;
      (*policy->_vptr_MembranePolicy[6])(&local_e0,policy,&local_f0);
      local_103 = 1;
    }
    ClientHook::from(&this->super_ClientHook,&local_e0);
    if (!reverse) {
      Capability::Client::~Client(&local_e0);
      Capability::Client::~Client(&local_118);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_128);
    }
    if ((local_103 & 1) != 0) {
      Capability::Client::~Client(&local_e0);
    }
    if ((local_102 & 1) != 0) {
      Capability::Client::~Client(&local_f0);
    }
    if ((local_101 & 1) != 0) {
      kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_100);
    }
    pCVar7 = kj::Own::operator_cast_to_ClientHook_((Own *)this);
    *local_b8 = pCVar7;
    pCVar7 = extraout_RDX_00;
  }
  else {
    (*(*local_b8)->_vptr_ClientHook[4])(this);
    pCVar7 = extraout_RDX_01;
  }
LAB_004d5496:
  OVar8.ptr = pCVar7;
  OVar8.disposer = (Disposer *)this;
  return OVar8;
}

Assistant:

static kj::Own<ClientHook> wrap(ClientHook& cap, MembranePolicy& policy, bool reverse) {
    if (cap.isBrand(MEMBRANE_BRAND)) {
      auto& otherMembrane = kj::downcast<MembraneHook>(cap);
      auto& rootPolicy = policy.rootPolicy();
      if (&otherMembrane.policy->rootPolicy() == &rootPolicy &&
          otherMembrane.reverse == !reverse) {
        // Capability that passed across the membrane one way is now passing back the other way.
        // Unwrap it rather than double-wrap it.
        Capability::Client unwrapped(otherMembrane.inner->addRef());
        return ClientHook::from(
            reverse ? rootPolicy.importInternal(kj::mv(unwrapped), *otherMembrane.policy, policy)
                    : rootPolicy.exportExternal(kj::mv(unwrapped), *otherMembrane.policy, policy));
      }
    }

    auto& map = reverse ? policy.reverseWrappers : policy.wrappers;
    ClientHook*& slot = map.findOrCreate(&cap, [&]() -> kj::Decay<decltype(map)>::Entry {
      return { &cap, nullptr };
    });
    if (slot == nullptr) {
      auto result = ClientHook::from(
          reverse ? policy.importExternal(Capability::Client(cap.addRef()))
                  : policy.exportInternal(Capability::Client(cap.addRef())));
      slot = result;
      return result;
    } else {
      return slot->addRef();
    }
  }